

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  undefined8 in_RAX;
  undefined8 uVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar4;
  char *begin_string_quote;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  pcVar2 = *needle;
  __haystack = *haystack;
  local_50 = haystack_expr;
  local_48 = needle_expr;
  if (pcVar2 == (char *)0x0 || __haystack == (char *)0x0) {
    uVar1 = CONCAT71((int7)((ulong)in_RAX >> 8),pcVar2 == __haystack);
  }
  else {
    pcVar2 = strstr(__haystack,pcVar2);
    uVar1 = CONCAT71((int7)((ulong)pcVar2 >> 8),pcVar2 != (char *)0x0);
    needle_expr = (char *)extraout_RDX;
  }
  if (SUB81(uVar1,0) == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_58 = "\"";
    local_38.success_ = false;
    local_38.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_38,(char (*) [11])"Value of: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_48);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x14c566);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x14bea9);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,needle);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x14c883);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x14beb5);
    local_40 = "not ";
    if (expected_to_be_substring) {
      local_40 = "";
    }
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_40);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"a substring of ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x14c566);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x14be76);
    pAVar3 = AssertionResult::operator<<(pAVar3,&local_58);
    pAVar3 = AssertionResult::operator<<(pAVar3,haystack);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x14c870);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar3);
    internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar1 = extraout_RAX;
    needle_expr = (char *)extraout_RDX_00;
  }
  AVar4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)needle_expr;
  AVar4._0_8_ = uVar1;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}